

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_outputs_tests.cpp
# Opt level: O0

void __thiscall
wallet::group_outputs_tests::outputs_grouping_tests::test_method(outputs_grouping_tests *this)

{
  bool bVar1;
  element_type *dest_00;
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  *nValue;
  T *pTVar2;
  element_type *peVar3;
  CWallet *this_00;
  element_type *this_01;
  element_type *file;
  long in_FS_OFFSET;
  CoinEligibilityFilter *avoid_partial_groups_filter;
  int PREVIOUS_ROUND_COUNT;
  unsigned_long i_2;
  uint16_t NUM_SINGLE_ENTRIES;
  unsigned_long i_1;
  unsigned_long i;
  unsigned_long GROUP_SIZE;
  CoinEligibilityFilter *BASIC_FILTER;
  shared_ptr<wallet::CWallet> *wallet;
  CTxDestination dest7;
  CTxDestination dest5;
  CTxDestination dest4;
  CTxDestination dest3;
  CTxDestination dest2;
  CTxDestination dest;
  GroupVerifier group_verifier;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  GroupVerifier *this_02;
  int in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  GroupVerifier *in_stack_fffffffffffff748;
  CoinsResult *in_stack_fffffffffffff750;
  element_type *in_stack_fffffffffffff758;
  const_string *in_stack_fffffffffffff760;
  NodeContext *in_stack_fffffffffffff768;
  int line;
  const_string *in_stack_fffffffffffff770;
  allocator<char> *in_stack_fffffffffffff778;
  allocator<char> *__a;
  char *in_stack_fffffffffffff780;
  CoinsResult *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  string *in_stack_fffffffffffff7b8;
  CWallet *in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7d0;
  OutputType OVar5;
  undefined8 in_stack_fffffffffffff818;
  CAmount *in_stack_fffffffffffff820;
  CTxDestination *in_stack_fffffffffffff828;
  CWallet *in_stack_fffffffffffff830;
  CWallet *wallet_00;
  CoinsResult *in_stack_fffffffffffff838;
  CFeeRate in_stack_fffffffffffff8b8;
  CFeeRate fee_rate;
  ulong local_738;
  ulong uVar6;
  allocator<char> local_6e1 [9];
  undefined8 local_6d8;
  allocator<char> local_6c9 [9];
  undefined8 local_6c0;
  allocator<char> local_6b1;
  const_string local_6b0 [2];
  lazy_ostream local_690 [2];
  undefined4 local_66c;
  assertion_result local_668 [2];
  undefined8 local_628;
  allocator<char> local_619 [9];
  undefined8 local_610;
  allocator<char> local_601 [9];
  undefined8 local_5f8;
  allocator<char> local_5e9 [25];
  int in_stack_fffffffffffffa30;
  CoinsResult local_d8 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  NewWallet(in_stack_fffffffffffff768);
  GroupVerifier::GroupVerifier(in_stack_fffffffffffff748);
  std::shared_ptr<wallet::CWallet>::operator=
            (&in_stack_fffffffffffff748->wallet,
             (shared_ptr<wallet::CWallet> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740));
  CoinEligibilityFilter::CoinEligibilityFilter
            ((CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,(uint64_t)in_stack_fffffffffffff738);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  CWallet::GetNewDestination
            (in_stack_fffffffffffff7c0,(OutputType)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
             in_stack_fffffffffffff7b8);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_fffffffffffff778,(char *)in_stack_fffffffffffff770,
             (int)((ulong)in_stack_fffffffffffff768 >> 0x20),(char *)in_stack_fffffffffffff760,
             (char *)in_stack_fffffffffffff758);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)in_stack_fffffffffffff738);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff738,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xda9951);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_fffffffffffff738);
  std::__cxx11::string::~string(in_stack_fffffffffffff738);
  std::allocator<char>::~allocator(local_5e9);
  for (uVar6 = 0; uVar6 < 10; uVar6 = uVar6 + 1) {
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff748);
    local_5f8 = 1000000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffff738,0);
    in_stack_fffffffffffff738 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44((int)((ulong)in_stack_fffffffffffff738 >> 0x20),6);
    addCoin(in_stack_fffffffffffff838,in_stack_fffffffffffff830,in_stack_fffffffffffff828,
            in_stack_fffffffffffff820,SUB81((ulong)in_stack_fffffffffffff818 >> 0x38,0),
            in_stack_fffffffffffff8b8,in_stack_fffffffffffffa30);
  }
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  CWallet::GetNewDestination
            (in_stack_fffffffffffff7c0,(OutputType)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
             in_stack_fffffffffffff7b8);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_fffffffffffff778,(char *)in_stack_fffffffffffff770,
             (int)((ulong)in_stack_fffffffffffff768 >> 0x20),(char *)in_stack_fffffffffffff760,
             (char *)in_stack_fffffffffffff758);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)in_stack_fffffffffffff738);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff738,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xda9bde);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_fffffffffffff738);
  std::__cxx11::string::~string(in_stack_fffffffffffff738);
  std::allocator<char>::~allocator(local_601);
  for (local_738 = 0; OVar5 = (OutputType)((ulong)in_stack_fffffffffffff7d0 >> 0x20), local_738 < 10
      ; local_738 = local_738 + 1) {
    in_stack_fffffffffffff838 = local_d8;
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffff748);
    local_610 = 500000000;
    CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffff738,0);
    in_stack_fffffffffffff738 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44((int)((ulong)in_stack_fffffffffffff738 >> 0x20),6);
    addCoin(in_stack_fffffffffffff838,in_stack_fffffffffffff830,in_stack_fffffffffffff828,
            in_stack_fffffffffffff820,SUB81((ulong)in_stack_fffffffffffff818 >> 0x38,0),
            in_stack_fffffffffffff8b8,in_stack_fffffffffffffa30);
  }
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)in_stack_fffffffffffff738 >> 0x38,0));
  dest_00 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff738);
  wallet_00 = (CWallet *)local_619;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  CWallet::GetNewDestination(in_stack_fffffffffffff7c0,OVar5,in_stack_fffffffffffff7b8);
  nValue = inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                     ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                       *)in_stack_fffffffffffff778,(char *)in_stack_fffffffffffff770,
                      (int)((ulong)in_stack_fffffffffffff768 >> 0x20),
                      (char *)in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
  pTVar2 = util::
           Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                        *)in_stack_fffffffffffff738);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)in_stack_fffffffffffff738,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xda9e51);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)in_stack_fffffffffffff738);
  std::__cxx11::string::~string(in_stack_fffffffffffff738);
  std::allocator<char>::~allocator(local_619);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff748);
  local_628 = 1;
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffff738,0);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffff738 >> 0x20),6);
  addCoin(in_stack_fffffffffffff838,wallet_00,(CTxDestination *)dest_00,(CAmount *)nValue,
          SUB81((ulong)pTVar2 >> 0x38,0),in_stack_fffffffffffff8b8,in_stack_fffffffffffffa30);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff748,
               (pointer)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               (unsigned_long)pbVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pbVar4);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff778,in_stack_fffffffffffff770,
               (size_t)in_stack_fffffffffffff768,in_stack_fffffffffffff760);
    local_66c = 2;
    std::
    map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
    ::operator[]((map<OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>_>_>
                  *)in_stack_fffffffffffff760,(key_type *)in_stack_fffffffffffff758);
    std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::back
              ((vector<wallet::COutput,_std::allocator<wallet::COutput>_> *)pbVar4);
    COutput::GetEffectiveValue((COutput *)in_stack_fffffffffffff748);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff748,
               SUB41((uint)in_stack_fffffffffffff744 >> 0x18,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff748,
               (pointer)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               (unsigned_long)pbVar4);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               (basic_cstring<const_char> *)pbVar4);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff748,
               (pointer)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
               (unsigned_long)pbVar4);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_668,local_690,local_6b0,0x9d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pbVar4);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pbVar4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)pbVar4 >> 0x38,0));
  line = (int)((ulong)in_stack_fffffffffffff768 >> 0x20);
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)pbVar4 >> 0x38,0));
  peVar3 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)pbVar4);
  OVar5 = (OutputType)((ulong)peVar3 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  CWallet::GetNewDestination(in_stack_fffffffffffff7c0,OVar5,in_stack_fffffffffffff7b8);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_fffffffffffff778,(char *)in_stack_fffffffffffff770,line,
             (char *)in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
  this_00 = (CWallet *)
            util::
            Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
            ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
                         *)pbVar4);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)pbVar4,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xdaa1c6);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)pbVar4);
  std::__cxx11::string::~string(pbVar4);
  std::allocator<char>::~allocator(&local_6b1);
  peVar3 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)in_stack_fffffffffffff748);
  local_6c0 = 600000000;
  CFeeRate::CFeeRate<int>((CFeeRate *)pbVar4,0);
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT44((int)((ulong)pbVar4 >> 0x20),5);
  addCoin(in_stack_fffffffffffff838,wallet_00,(CTxDestination *)dest_00,(CAmount *)nValue,
          SUB81((ulong)pTVar2 >> 0x38,0),in_stack_fffffffffffff8b8,in_stack_fffffffffffffa30);
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)pbVar4 >> 0x38,0));
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             pbVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff788,in_stack_fffffffffffff780,in_stack_fffffffffffff778);
  CWallet::GetNewDestination(this_00,OVar5,(string *)peVar3);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)in_stack_fffffffffffff778,(char *)in_stack_fffffffffffff770,line,
             (char *)in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)pbVar4);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)pbVar4,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xdaa349);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)pbVar4);
  std::__cxx11::string::~string(pbVar4);
  std::allocator<char>::~allocator(local_6c9);
  __s = local_d8;
  this_01 = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator*((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_stack_fffffffffffff748);
  local_6d8 = 600000000;
  CFeeRate::CFeeRate<int>((CFeeRate *)pbVar4,0);
  this_02 = (GroupVerifier *)((ulong)pbVar4 & 0xffffffff00000000);
  addCoin(in_stack_fffffffffffff838,wallet_00,(CTxDestination *)dest_00,(CAmount *)nValue,
          SUB81((ulong)pTVar2 >> 0x38,0),in_stack_fffffffffffff8b8,in_stack_fffffffffffffa30);
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)this_02 >> 0x38,0));
  file = std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)this_02);
  __a = local_6e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)__s,__a);
  CWallet::GetNewDestination(this_00,OVar5,(string *)peVar3);
  inline_assertion_check<true,util::Result<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
            ((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
              *)__a,(char *)file,line,(char *)in_stack_fffffffffffff760,
             (char *)in_stack_fffffffffffff758);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::operator*((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
               *)this_02);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)this_02,
            (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             *)0xdaa4c9);
  util::
  Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
  ::~Result((Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
             *)this_02);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
  std::allocator<char>::~allocator(local_6e1);
  for (fee_rate.nSatoshisPerK = 0; (ulong)fee_rate.nSatoshisPerK < 0x65;
      fee_rate.nSatoshisPerK = fee_rate.nSatoshisPerK + 1) {
    in_stack_fffffffffffff750 = local_d8;
    in_stack_fffffffffffff758 =
         std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_stack_fffffffffffff748);
    CFeeRate::CFeeRate<int>((CFeeRate *)this_02,0);
    this_02 = (GroupVerifier *)CONCAT44((int)((ulong)this_02 >> 0x20),6);
    addCoin(in_stack_fffffffffffff838,wallet_00,(CTxDestination *)dest_00,(CAmount *)nValue,
            SUB81((ulong)pTVar2 >> 0x38,0),fee_rate,in_stack_fffffffffffffa30);
  }
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)this_02 >> 0x38,0));
  CoinEligibilityFilter::CoinEligibilityFilter
            ((CoinEligibilityFilter *)in_stack_fffffffffffff758,
             (int)((ulong)in_stack_fffffffffffff750 >> 0x20),(int)in_stack_fffffffffffff750,
             (uint64_t)in_stack_fffffffffffff748,
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
             SUB81((ulong)this_02 >> 0x38,0));
  GroupVerifier::GroupAndVerify
            ((GroupVerifier *)in_stack_fffffffffffff758,
             (OutputType)((ulong)in_stack_fffffffffffff750 >> 0x20),
             (CoinEligibilityFilter *)in_stack_fffffffffffff748,in_stack_fffffffffffff744,
             in_stack_fffffffffffff740,SUB81((ulong)this_02 >> 0x38,0));
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)this_02);
  GroupVerifier::~GroupVerifier(this_02);
  std::shared_ptr<wallet::CWallet>::~shared_ptr(&this_02->wallet);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(outputs_grouping_tests)
{
    const auto& wallet = NewWallet(m_node);
    GroupVerifier group_verifier;
    group_verifier.wallet = wallet;

    const CoinEligibilityFilter& BASIC_FILTER{1, 6, 0};

    // #################################################################################
    // 10 outputs from different txs going to the same script
    // 1) if partial spends is enabled --> must not be grouped
    // 2) if partial spends is not enabled --> must be grouped into a single OutputGroup
    // #################################################################################

    unsigned long GROUP_SIZE = 10;
    const CTxDestination dest = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    for (unsigned long i = 0; i < GROUP_SIZE; i++) {
        addCoin(group_verifier.coins_pool, *wallet, dest, 10 * COIN, /*is_from_me=*/true);
    }

    group_verifier.GroupAndVerify(OutputType::BECH32,
                                  BASIC_FILTER,
                                  /*expected_with_partial_spends_size=*/ GROUP_SIZE,
                                  /*expected_without_partial_spends_size=*/ 1,
                                  /*positive_only=*/ true);

    // ####################################################################################
    // 3) 10 more UTXO are added with a different script --> must be grouped into a single
    //    group for avoid partial spends and 10 different output groups for partial spends
    // ####################################################################################

    const CTxDestination dest2 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    for (unsigned long i = 0; i < GROUP_SIZE; i++) {
        addCoin(group_verifier.coins_pool, *wallet, dest2, 5 * COIN, /*is_from_me=*/true);
    }

    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2,
            /*expected_without_partial_spends_size=*/ 2,
            /*positive_only=*/ true);

    // ################################################################################
    // 4) Now add a negative output --> which will be skipped if "positive_only" is set
    // ################################################################################

    const CTxDestination dest3 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    addCoin(group_verifier.coins_pool, *wallet, dest3, 1, true, CFeeRate(100));
    BOOST_CHECK(group_verifier.coins_pool.coins[OutputType::BECH32].back().GetEffectiveValue() <= 0);

    // First expect no changes with "positive_only" enabled
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2,
            /*expected_without_partial_spends_size=*/ 2,
            /*positive_only=*/ true);

    // Then expect changes with "positive_only" disabled
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2 + 1,
            /*expected_without_partial_spends_size=*/ 3,
            /*positive_only=*/ false);


    // ##############################################################################
    // 5) Try to add a non-eligible UTXO (due not fulfilling the min depth target for
    //    "not mine" UTXOs) --> it must not be added to any group
    // ##############################################################################

    const CTxDestination dest4 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    addCoin(group_verifier.coins_pool, *wallet, dest4, 6 * COIN,
            /*is_from_me=*/false, CFeeRate(0), /*depth=*/5);

    // Expect no changes from this round and the previous one (point 4)
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2 + 1,
            /*expected_without_partial_spends_size=*/ 3,
            /*positive_only=*/ false);


    // ##############################################################################
    // 6) Try to add a non-eligible UTXO (due not fulfilling the min depth target for
    //    "mine" UTXOs) --> it must not be added to any group
    // ##############################################################################

    const CTxDestination dest5 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    addCoin(group_verifier.coins_pool, *wallet, dest5, 6 * COIN,
            /*is_from_me=*/true, CFeeRate(0), /*depth=*/0);

    // Expect no changes from this round and the previous one (point 5)
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ GROUP_SIZE * 2 + 1,
            /*expected_without_partial_spends_size=*/ 3,
            /*positive_only=*/ false);

    // ###########################################################################################
    // 7) Surpass the OUTPUT_GROUP_MAX_ENTRIES and verify that a second partial group gets created
    // ###########################################################################################

    const CTxDestination dest7 = *Assert(wallet->GetNewDestination(OutputType::BECH32, ""));
    uint16_t NUM_SINGLE_ENTRIES = 101;
    for (unsigned long i = 0; i < NUM_SINGLE_ENTRIES; i++) { // OUTPUT_GROUP_MAX_ENTRIES{100}
        addCoin(group_verifier.coins_pool, *wallet, dest7, 9 * COIN, /*is_from_me=*/true);
    }

    // Exclude partial groups only adds one more group to the previous test case (point 6)
    int PREVIOUS_ROUND_COUNT = GROUP_SIZE * 2 + 1;
    group_verifier.GroupAndVerify(OutputType::BECH32,
            BASIC_FILTER,
            /*expected_with_partial_spends_size=*/ PREVIOUS_ROUND_COUNT + NUM_SINGLE_ENTRIES,
            /*expected_without_partial_spends_size=*/ 4,
            /*positive_only=*/ false);

    // Include partial groups should add one more group inside the "avoid partial spends" count
    const CoinEligibilityFilter& avoid_partial_groups_filter{1, 6, 0, 0, /*include_partial=*/ true};
    group_verifier.GroupAndVerify(OutputType::BECH32,
            avoid_partial_groups_filter,
            /*expected_with_partial_spends_size=*/ PREVIOUS_ROUND_COUNT + NUM_SINGLE_ENTRIES,
            /*expected_without_partial_spends_size=*/ 5,
            /*positive_only=*/ false);
}